

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void body(LexState *ls,expdesc *e,int needself,int line)

{
  Token *pTVar1;
  Token *pTVar2;
  byte bVar3;
  LocVar *pLVar4;
  global_State *g;
  SemInfo SVar5;
  undefined4 uVar6;
  byte bVar7;
  int iVar8;
  TString *pTVar9;
  FuncState *pFVar10;
  Proto **ppPVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  Proto *pPVar16;
  FuncState *fs;
  FuncState *pFVar17;
  FuncState new_fs;
  FuncState local_288;
  
  open_func(ls,&local_288);
  (local_288.f)->linedefined = line;
  checknext(ls,0x28);
  if (needself == 0) {
    pFVar17 = ls->fs;
    pPVar16 = pFVar17->f;
  }
  else {
    pTVar9 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar9,0);
    pFVar17 = ls->fs;
    bVar7 = pFVar17->nactvar + 1;
    pFVar17->nactvar = bVar7;
    pPVar16 = pFVar17->f;
    pPVar16->locvars[*(ushort *)&pFVar17->upvalues[(ulong)bVar7 + 0x3b].info].startpc = pFVar17->pc;
  }
  pPVar16->is_vararg = '\0';
  iVar8 = (ls->t).token;
  iVar15 = 0;
  bVar7 = 0;
  if (iVar8 != 0x29) {
    pTVar1 = &ls->t;
    while (iVar8 == 0x11d) {
      pTVar9 = str_checkname(ls);
      new_localvar(ls,pTVar9,iVar15);
      if (pPVar16->is_vararg != '\0') {
LAB_0010eded:
        pFVar10 = ls->fs;
        bVar7 = pFVar10->nactvar + (char)iVar15 + 1;
        uVar12 = (uint)bVar7;
        pFVar10->nactvar = bVar7;
        iVar15 = iVar15 + 1;
        goto LAB_0010ee63;
      }
      iVar8 = testnext(ls,0x2c);
      if (iVar8 == 0) goto LAB_0010eded;
      iVar15 = iVar15 + 1;
      iVar8 = pTVar1->token;
    }
    if (iVar8 != 0x117) {
      luaX_lexerror(ls,"<name> or \'...\' expected",iVar8);
    }
    iVar8 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar8 == 0x11f) {
      iVar8 = llex(ls,&(ls->t).seminfo);
      (ls->t).token = iVar8;
    }
    else {
      pTVar2 = &ls->lookahead;
      uVar6 = *(undefined4 *)&pTVar2->field_0x4;
      SVar5 = (ls->lookahead).seminfo;
      pTVar1->token = pTVar2->token;
      *(undefined4 *)&pTVar1->field_0x4 = uVar6;
      (ls->t).seminfo = SVar5;
      pTVar2->token = 0x11f;
    }
    bVar7 = pPVar16->is_vararg | 2;
    pPVar16->is_vararg = bVar7;
    pFVar10 = ls->fs;
    uVar12 = (uint)pFVar10->nactvar + iVar15;
    pFVar10->nactvar = (lu_byte)uVar12;
    if (iVar15 != 0) {
LAB_0010ee63:
      iVar8 = pFVar10->pc;
      pLVar4 = pFVar10->f->locvars;
      lVar14 = -(long)iVar15;
      do {
        pLVar4[pFVar10->actvar[(ulong)(uVar12 & 0xff) + lVar14]].startpc = iVar8;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
      bVar7 = pPVar16->is_vararg;
    }
  }
  bVar3 = pFVar17->nactvar;
  pPVar16->numparams = bVar3 - (bVar7 & 1);
  luaK_checkstack(pFVar17,(uint)bVar3);
  pFVar17->freereg = pFVar17->freereg + (uint)bVar3;
  checknext(ls,0x29);
  chunk(ls);
  (local_288.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  close_func(ls);
  pFVar17 = ls->fs;
  pPVar16 = pFVar17->f;
  iVar8 = pPVar16->sizep;
  lVar14 = (long)iVar8;
  if (iVar8 <= pFVar17->np) {
    ppPVar11 = (Proto **)
               luaM_growaux_(ls->L,pPVar16->p,&pPVar16->sizep,8,0x3ffff,"constant table overflow");
    pPVar16->p = ppPVar11;
    iVar15 = pPVar16->sizep;
    if (iVar8 < iVar15) {
      do {
        pPVar16->p[lVar14] = (Proto *)0x0;
        lVar14 = lVar14 + 1;
      } while (iVar15 != lVar14);
    }
  }
  ppPVar11 = pPVar16->p;
  iVar8 = pFVar17->np;
  pFVar17->np = iVar8 + 1;
  ppPVar11[iVar8] = local_288.f;
  if ((((local_288.f)->marked & 3) != 0) && ((pPVar16->marked & 4) != 0)) {
    g = ls->L->l_G;
    if (g->gcstate == '\x01') {
      reallymarkobject(g,(GCObject *)local_288.f);
    }
    else {
      pPVar16->marked = g->currentwhite & 3 | pPVar16->marked & 0xf8;
    }
  }
  iVar8 = luaK_code(pFVar17,pFVar17->np * 0x4000 - 0x3fdc,pFVar17->ls->lastline);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).s.info = iVar8;
  if ((local_288.f)->nups != '\0') {
    uVar13 = 0;
    do {
      luaK_code(pFVar17,(uint)local_288.upvalues[uVar13].info * 0x800000 +
                        (uint)(local_288.upvalues[uVar13].k != '\x06') * 4,pFVar17->ls->lastline);
      uVar13 = uVar13 + 1;
    } while (uVar13 < (local_288.f)->nups);
  }
  return;
}

Assistant:

static void body(LexState*ls,expdesc*e,int needself,int line){
FuncState new_fs;
open_func(ls,&new_fs);
new_fs.f->linedefined=line;
checknext(ls,'(');
if(needself){
new_localvarliteral(ls,"self",0);
adjustlocalvars(ls,1);
}
parlist(ls);
checknext(ls,')');
chunk(ls);
new_fs.f->lastlinedefined=ls->linenumber;
check_match(ls,TK_END,TK_FUNCTION,line);
close_func(ls);
pushclosure(ls,&new_fs,e);
}